

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

char __thiscall smf::Options::getType(Options *this,string *optionName)

{
  int iVar1;
  reference ppOVar2;
  int index;
  string *optionName_local;
  Options *this_local;
  
  iVar1 = getRegIndex(this,optionName);
  if (iVar1 < 0) {
    this_local._7_1_ = -1;
  }
  else {
    iVar1 = getRegIndex(this,optionName);
    ppOVar2 = std::vector<smf::Option_register_*,_std::allocator<smf::Option_register_*>_>::
              operator[](&this->m_optionRegister,(long)iVar1);
    this_local._7_1_ = Option_register::getType(*ppOVar2);
  }
  return this_local._7_1_;
}

Assistant:

char Options::getType(const std::string& optionName) {
	int index = getRegIndex(optionName);
	if (index < 0) {
		return -1;
	} else {
		return m_optionRegister[getRegIndex(optionName)]->getType();
	}
}